

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_get_sig_alg
              (mbedtls_x509_buf *sig_oid,mbedtls_x509_buf *sig_params,mbedtls_md_type_t *md_alg,
              mbedtls_pk_type_t *pk_alg,void **sig_opts)

{
  bool bVar1;
  int iVar2;
  mbedtls_md_type_t *mgf_md;
  int iVar3;
  
  iVar3 = -0x2800;
  if (*sig_opts != (void *)0x0) {
    return -0x2800;
  }
  iVar2 = mbedtls_oid_get_sig_alg(sig_oid,md_alg,pk_alg);
  if (iVar2 != 0) {
    return iVar2 + -0x2600;
  }
  if (*pk_alg != MBEDTLS_PK_RSASSA_PSS) {
    if ((sig_params->tag != 5) && (sig_params->tag != 0)) {
      return -0x2300;
    }
    if (sig_params->len == 0) {
      return 0;
    }
    return -0x2300;
  }
  mgf_md = (mbedtls_md_type_t *)calloc(1,8);
  if (mgf_md == (mbedtls_md_type_t *)0x0) {
    iVar3 = -0x2880;
  }
  else {
    iVar2 = mbedtls_x509_get_rsassa_pss_params(sig_params,md_alg,mgf_md,(int *)(mgf_md + 1));
    if (iVar2 == 0) {
      *sig_opts = mgf_md;
      bVar1 = true;
      goto LAB_00185180;
    }
    free(mgf_md);
    iVar3 = iVar2;
  }
  bVar1 = false;
LAB_00185180:
  if (bVar1) {
    return 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_x509_get_sig_alg( const mbedtls_x509_buf *sig_oid, const mbedtls_x509_buf *sig_params,
                      mbedtls_md_type_t *md_alg, mbedtls_pk_type_t *pk_alg,
                      void **sig_opts )
{
    int ret;

    if( *sig_opts != NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    if( ( ret = mbedtls_oid_get_sig_alg( sig_oid, md_alg, pk_alg ) ) != 0 )
        return( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG + ret );

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
    if( *pk_alg == MBEDTLS_PK_RSASSA_PSS )
    {
        mbedtls_pk_rsassa_pss_options *pss_opts;

        pss_opts = mbedtls_calloc( 1, sizeof( mbedtls_pk_rsassa_pss_options ) );
        if( pss_opts == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        ret = mbedtls_x509_get_rsassa_pss_params( sig_params,
                                          md_alg,
                                          &pss_opts->mgf1_hash_id,
                                          &pss_opts->expected_salt_len );
        if( ret != 0 )
        {
            mbedtls_free( pss_opts );
            return( ret );
        }

        *sig_opts = (void *) pss_opts;
    }
    else
#endif /* MBEDTLS_X509_RSASSA_PSS_SUPPORT */
    {
        /* Make sure parameters are absent or NULL */
        if( ( sig_params->tag != MBEDTLS_ASN1_NULL && sig_params->tag != 0 ) ||
              sig_params->len != 0 )
        return( MBEDTLS_ERR_X509_INVALID_ALG );
    }

    return( 0 );
}